

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeduh.c
# Opt level: O0

DUH * make_duh(int32 length,int n_tags,char *(*tags) [2],int n_signals,DUH_SIGTYPE_DESC **desc,
              sigdata_t **sigdata)

{
  bool bVar1;
  int iVar2;
  DUH_SIGNAL **ppDVar3;
  DUH_SIGNAL *pDVar4;
  size_t sVar5;
  size_t sVar6;
  char *(*papcVar7) [2];
  char *pcVar8;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  int32 in_EDI;
  long in_R8;
  long in_R9;
  char *ptr;
  int mem;
  int fail;
  int i;
  DUH *duh;
  DUH *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_3c;
  DUH *local_38;
  DUH *local_8;
  
  local_38 = (DUH *)malloc(0x20);
  if (local_38 != (DUH *)0x0) {
    local_38->n_signals = in_ECX;
    ppDVar3 = (DUH_SIGNAL **)malloc((long)in_ECX << 3);
    local_38->signal = ppDVar3;
    if (local_38->signal == (DUH_SIGNAL **)0x0) {
      free(local_38);
      local_38 = (DUH *)0x0;
    }
  }
  if (local_38 == (DUH *)0x0) {
    for (local_3c = 0; local_3c < in_ECX; local_3c = local_3c + 1) {
      if ((*(long *)(*(long *)(in_R8 + (long)local_3c * 8) + 0x38) != 0) &&
         (*(long *)(in_R9 + (long)local_3c * 8) != 0)) {
        (**(code **)(*(long *)(in_R8 + (long)local_3c * 8) + 0x38))
                  (*(undefined8 *)(in_R9 + (long)local_3c * 8));
      }
    }
    local_8 = (DUH *)0x0;
  }
  else {
    local_38->n_tags = 0;
    local_38->tag = (char *(*) [2])0x0;
    bVar1 = false;
    for (local_3c = 0; local_3c < in_ECX; local_3c = local_3c + 1) {
      pDVar4 = make_signal((DUH_SIGTYPE_DESC *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           in_stack_ffffffffffffffb0);
      local_38->signal[local_3c] = pDVar4;
      if (local_38->signal[local_3c] == (DUH_SIGNAL *)0x0) {
        bVar1 = true;
      }
    }
    if (bVar1) {
      unload_duh(in_stack_ffffffffffffffb0);
      local_8 = (DUH *)0x0;
    }
    else {
      local_38->length = in_EDI;
      iVar2 = in_ESI << 1;
      for (local_3c = 0; local_3c < in_ESI; local_3c = local_3c + 1) {
        sVar5 = strlen(*(char **)(in_RDX + (long)local_3c * 0x10));
        sVar6 = strlen(*(char **)(in_RDX + (long)local_3c * 0x10 + 8));
        iVar2 = (int)sVar5 + (int)sVar6 + iVar2;
      }
      if (iVar2 < 1) {
        local_8 = local_38;
      }
      else {
        papcVar7 = (char *(*) [2])malloc((long)in_ESI << 4);
        local_38->tag = papcVar7;
        if (local_38->tag == (char *(*) [2])0x0) {
          local_8 = local_38;
        }
        else {
          pcVar8 = (char *)malloc((long)iVar2);
          (*local_38->tag)[0] = pcVar8;
          if ((*local_38->tag)[0] == (char *)0x0) {
            free(local_38->tag);
            local_38->tag = (char *(*) [2])0x0;
            local_8 = local_38;
          }
          else {
            local_38->n_tags = in_ESI;
            pcVar8 = (*local_38->tag)[0];
            for (local_3c = 0; local_3c < in_ESI; local_3c = local_3c + 1) {
              local_38->tag[local_3c][0] = pcVar8;
              strcpy(pcVar8,*(char **)(in_RDX + (long)local_3c * 0x10));
              sVar5 = strlen(*(char **)(in_RDX + (long)local_3c * 0x10));
              pcVar8 = pcVar8 + sVar5 + 1;
              local_38->tag[local_3c][1] = pcVar8;
              strcpy(pcVar8,*(char **)(in_RDX + (long)local_3c * 0x10 + 8));
              sVar5 = strlen(*(char **)(in_RDX + (long)local_3c * 0x10 + 8));
              pcVar8 = pcVar8 + sVar5 + 1;
            }
            local_8 = local_38;
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

DUH *make_duh(
	int32 length,
	int n_tags,
	const char *const tags[][2],
	int n_signals,
	DUH_SIGTYPE_DESC *desc[],
	sigdata_t *sigdata[]
)
{
	DUH *duh = malloc(sizeof(*duh));
	int i;
	int fail;

	if (duh) {
		duh->n_signals = n_signals;

		duh->signal = malloc(n_signals * sizeof(*duh->signal));

		if (!duh->signal) {
			free(duh);
			duh = NULL;
		}
	}

	if (!duh) {
		for (i = 0; i < n_signals; i++)
			if (desc[i]->unload_sigdata)
				if (sigdata[i])
					(*desc[i]->unload_sigdata)(sigdata[i]);
		return NULL;
	}

	duh->n_tags = 0;
	duh->tag = NULL;

	fail = 0;

	for (i = 0; i < n_signals; i++) {
		duh->signal[i] = make_signal(desc[i], sigdata[i]);
		if (!duh->signal[i])
			fail = 1;
	}

	if (fail) {
		unload_duh(duh);
		return NULL;
	}

	duh->length = length;

	{
		int mem = n_tags * 2; /* account for NUL terminators here */
		char *ptr;

		for (i = 0; i < n_tags; i++)
			mem += (int)(strlen(tags[i][0]) + strlen(tags[i][1]));

		if (mem <= 0) return duh;

		duh->tag = malloc(n_tags * sizeof(*duh->tag));
		if (!duh->tag) return duh;
		duh->tag[0][0] = malloc(mem);
		if (!duh->tag[0][0]) {
			free(duh->tag);
			duh->tag = NULL;
			return duh;
		}
		duh->n_tags = n_tags;
		ptr = duh->tag[0][0];
		for (i = 0; i < n_tags; i++) {
			duh->tag[i][0] = ptr;
			strcpy(ptr, tags[i][0]);
			ptr += strlen(tags[i][0]) + 1;
			duh->tag[i][1] = ptr;
			strcpy(ptr, tags[i][1]);
			ptr += strlen(tags[i][1]) + 1;
		}
	}

	return duh;
}